

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardShapes.cpp
# Opt level: O0

void Assimp::StandardShapes::MakeSphere
               (uint tess,vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *positions)

{
  uint uVar1;
  size_type sVar2;
  undefined4 local_1c;
  uint i;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *positions_local;
  uint tess_local;
  
  sVar2 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(positions);
  uVar1 = integer_pow(4,tess);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
            (positions,sVar2 + uVar1 * 0x3c);
  MakeIcosahedron(positions);
  for (local_1c = 0; local_1c < tess; local_1c = local_1c + 1) {
    Subdivide(positions);
  }
  return;
}

Assistant:

void StandardShapes::MakeSphere(unsigned int    tess,
    std::vector<aiVector3D>& positions)
{
    // Reserve enough storage. Every subdivision
    // splits each triangle in 4, the icosahedron consists of 60 verts
    positions.reserve(positions.size()+60 * integer_pow(4, tess));

    // Construct an icosahedron to start with
    MakeIcosahedron(positions);

    // ... and subdivide it until the requested output
    // tessellation is reached
    for (unsigned int i = 0; i<tess;++i)
        Subdivide(positions);
}